

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

Result __thiscall
Inferences::SimplifyingGeneratingLiteralSimplification::simplify
          (SimplifyingGeneratingLiteralSimplification *this,Clause *cl_,bool doOrderingCheck)

{
  bool bVar1;
  uint uVar2;
  Literal *pLVar3;
  Clause *pCVar4;
  byte in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  Clause *in_RSI;
  long *in_RDI;
  Result RVar5;
  Clause *result_1;
  Result cmp;
  Literal *simplLit;
  bool trivialValue;
  Result simpl;
  Result result;
  Literal *orig;
  uint i;
  bool oneLess;
  bool allLessEq;
  bool changed;
  Stack<Kernel::Literal_*> out;
  Clause *cl;
  SimplifyingInference1 *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe87;
  size_t in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  Inference *in_stack_fffffffffffffee8;
  uint uVar6;
  SimplifyingInference1 local_100;
  Inference local_f0;
  Clause *local_c0;
  int local_b4;
  Literal *local_b0;
  undefined4 local_a8;
  undefined1 local_a1;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_80;
  undefined4 local_78;
  Literal *local_70;
  uint local_58;
  byte local_53;
  byte local_52;
  byte local_51;
  Clause *local_30;
  byte local_21;
  Clause *local_20;
  Clause *local_10;
  byte local_8;
  
  local_21 = in_DL & 1;
  local_30 = in_RSI;
  local_20 = in_RSI;
  Kernel::Clause::size(in_RSI);
  Lib::Stack<Kernel::Literal_*>::Stack
            ((Stack<Kernel::Literal_*> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
            );
  local_51 = 0;
  local_52 = 1;
  local_53 = 0;
  local_58 = 0;
  do {
    uVar6 = local_58;
    uVar2 = Kernel::Clause::size(local_30);
    if (uVar2 <= uVar6) {
      if ((local_51 & 1) == 0) {
        RVar5 = SimplifyingGeneratingInference1::Result::nop(local_20);
        local_8 = RVar5.premiseRedundant;
        local_10 = RVar5.simplified;
      }
      else {
        Kernel::SimplifyingInference1::SimplifyingInference1
                  (&local_100,*(InferenceRule *)(in_RDI + 5),local_20);
        Kernel::Inference::Inference
                  ((Inference *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
        pCVar4 = Kernel::Clause::fromStack
                           ((Stack<Kernel::Literal_*> *)CONCAT44(uVar2,uVar6),
                            in_stack_fffffffffffffee8);
        Kernel::Inference::~Inference(&local_f0);
        in_stack_fffffffffffffe87 = 0;
        if ((local_52 & 1) != 0) {
          in_stack_fffffffffffffe87 = local_53;
        }
        local_8 = in_stack_fffffffffffffe87 & 1;
        local_c0 = pCVar4;
        local_10 = pCVar4;
      }
LAB_007f54ce:
      local_a8 = 1;
      Lib::Stack<Kernel::Literal_*>::~Stack
                ((Stack<Kernel::Literal_*> *)
                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      RVar5._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      RVar5.premiseRedundant = (bool)local_8;
      RVar5.simplified = local_10;
      return RVar5;
    }
    in_stack_fffffffffffffee8 = (Inference *)Kernel::Clause::operator[](local_30,local_58);
    local_70 = *(Literal **)in_stack_fffffffffffffee8;
    local_90 = (**(code **)(*in_RDI + 0x40))(in_RDI,local_70);
    local_88 = CONCAT31(local_88._1_3_,extraout_DL);
    local_78 = local_88;
    local_80 = local_90;
    bVar1 = Result::isLiteral((Result *)0x7f5153);
    if ((bVar1) && (pLVar3 = Result::unwrapLiteral((Result *)0x7f5170), pLVar3 == local_70)) {
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)
                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (Literal *)in_stack_fffffffffffffe78);
    }
    else {
      local_98 = local_78;
      local_a0 = local_80;
      *(int *)(DAT_01333840 + 400) = *(int *)(DAT_01333840 + 400) + 1;
      bVar1 = Result::isConstant((Result *)0x7f51ff);
      if (bVar1) {
        local_a1 = Result::unwrapConstant((Result *)0x7f521c);
        if ((bool)local_a1) {
          RVar5 = SimplifyingGeneratingInference1::Result::tautology();
          local_8 = RVar5.premiseRedundant;
          local_10 = RVar5.simplified;
          goto LAB_007f54ce;
        }
        local_51 = 1;
      }
      else {
        local_b0 = Result::unwrapLiteral((Result *)0x7f528b);
        local_51 = 1;
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)
                   CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   (Literal *)in_stack_fffffffffffffe78);
        if ((local_21 & 1) != 0) {
          local_b4 = (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],local_b0,local_70);
          switch(local_b4) {
          case 1:
          case 3:
          case 4:
            if (local_b4 == 4) {
              *(int *)(DAT_01333840 + 0x188) = *(int *)(DAT_01333840 + 0x188) + 1;
            }
            else {
              *(int *)(DAT_01333840 + 0x18c) = *(int *)(DAT_01333840 + 0x18c) + 1;
            }
            local_52 = 0;
            break;
          case 2:
            local_53 = 1;
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

SimplifyingGeneratingInference1::Result SimplifyingGeneratingLiteralSimplification::simplify(Clause* cl_, bool doOrderingCheck) {
  DEBUG("in:  ", *cl_)
  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;
  bool allLessEq = true;
  bool oneLess = false;

  for (unsigned i = 0; i < cl.size(); i++) {

    auto orig = cl[i];
    auto result = simplifyLiteral(orig);

    if (result.isLiteral() && result.unwrapLiteral() == orig ) {
      out.push(orig);
    } else {
      auto simpl = result;
      env.statistics->evaluationCnt++;

      if (simpl.isConstant()) {

        bool trivialValue = simpl.unwrapConstant();
        if (trivialValue) {
          /* clause is a tautology and can be deleted */
          return SimplifyingGeneratingInference1::Result::tautology();
        } else {
          /* do not add the literal to the output stack */
          changed = true;
        }

      } else {

        Literal* simplLit = simpl.unwrapLiteral();
        ASS_NEQ(simplLit, orig)
        changed = true;
        out.push(simplLit);

        if (doOrderingCheck) {
          ASS(_ordering)
          auto cmp = _ordering->compare(simplLit, orig);
          switch(cmp) {
            case Ordering::Result::LESS:
              oneLess = true;
              break;
            case Ordering::Result::EQUAL:
              ASSERTION_VIOLATION
              break;
            case Ordering::Result::INCOMPARABLE:
            case Ordering::Result::GREATER:
              if (cmp == Ordering::Result::INCOMPARABLE) {
                env.statistics->evaluationIncomp++;
              } else {
                env.statistics->evaluationGreater++;
              }
              DEBUG("ordering violated: ", cmp)
              DEBUG("orig: ", *orig)
              DEBUG("simp: ", *simplLit)
              allLessEq = false;
              break;
          }
        }
      }
    }
  }


  if (!changed) {
    return SimplifyingGeneratingInference1::Result::nop(cl_);
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(_rule, cl_));
    DEBUG("out: ", *result)
    return SimplifyingGeneratingInference1::Result{
            .simplified = result, 
            .premiseRedundant = allLessEq && oneLess,
          };
  }
}